

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseScriptModule
          (WastParser *this,
          unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> *out_module)

{
  ScriptModule *pSVar1;
  pointer pbVar2;
  ScriptModule *pSVar3;
  bool bVar4;
  Result RVar5;
  TokenType TVar6;
  TokenTypePair TVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Token local_148;
  Token local_f8;
  undefined1 auStack_a8 [8];
  Location loc;
  string name;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  allocator local_22;
  allocator_type local_21;
  ScriptModule *local_20;
  
  RVar5 = Expect(this,Lpar);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation((Location *)auStack_a8,this);
  RVar5 = Expect(this,Module);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  loc.field_1._8_8_ = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  ParseBindVarOpt(this,(string *)((long)&loc.field_1 + 8));
  TVar6 = Peek(this,0);
  if (TVar6 == Bin) {
    Consume(&local_148,this);
    Token::~Token(&local_148);
    name.field_2._8_8_ = 0;
    RVar5 = ParseTextList(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               ((long)&name.field_2 + 8));
    if (RVar5.enum_ == Error) {
LAB_00dac3bf:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&name.field_2 + 8));
      RVar5.enum_ = Error;
      goto LAB_00dac50f;
    }
    MakeUnique<wabt::DataScriptModule<(wabt::ScriptModuleType)1>>();
    std::__cxx11::string::_M_assign
              ((string *)
               local_40.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].field_2._M_local_buf,
               (string *)(loc.field_1.field2 + 8));
LAB_00dac4a3:
    *(undefined4 *)
     &local_40.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p = (undefined4)loc.filename.size_
    ;
    *(undefined4 *)
     ((long)&local_40.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + 4) =
         loc.filename.size_._4_4_;
    *(int *)&local_40.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length =
         loc.field_1.field_0.line;
    *(int *)((long)&local_40.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length + 4) =
         loc.field_1.field_0.first_column;
    *(undefined4 *)
     &(local_40.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_2 = auStack_a8._0_4_;
    *(undefined4 *)
     ((long)&(local_40.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_2 + 4) = auStack_a8._4_4_;
    *(undefined4 *)
     ((long)&(local_40.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_2 + 8) = loc.filename.data_._0_4_;
    *(undefined4 *)
     ((long)&(local_40.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_2 + 0xc) = loc.filename.data_._4_4_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &local_40.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[2].field_2,
               (undefined1 *)((long)&name.field_2 + 8));
    pbVar2 = local_40.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pSVar1 = (out_module->_M_t).
             super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
             _M_t.
             super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
             super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
    (out_module->_M_t).
    super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
    super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = (ScriptModule *)pbVar2;
    if ((pSVar1 != (ScriptModule *)0x0) &&
       ((*pSVar1->_vptr_ScriptModule[1])(),
       local_40.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      (**(_func_int **)
         ((long)((local_40.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&name.field_2 + 8));
  }
  else {
    if (TVar6 == Quote) {
      Consume(&local_f8,this);
      Token::~Token(&local_f8);
      name.field_2._8_8_ = 0;
      RVar5 = ParseTextList(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 ((long)&name.field_2 + 8));
      if (RVar5.enum_ == Error) goto LAB_00dac3bf;
      MakeUnique<wabt::DataScriptModule<(wabt::ScriptModuleType)2>>();
      std::__cxx11::string::_M_assign
                ((string *)
                 local_40.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].field_2._M_local_buf,
                 (string *)(loc.field_1.field2 + 8));
      goto LAB_00dac4a3;
    }
    MakeUnique<wabt::TextScriptModule>();
    std::__cxx11::string::_M_assign((string *)(local_20 + 3),(string *)(loc.field_1.field2 + 8));
    local_20[2]._vptr_ScriptModule =
         (_func_int **)CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_);
    *(ulong *)&local_20[2].type_ =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    local_20[1]._vptr_ScriptModule = (_func_int **)CONCAT44(auStack_a8._4_4_,auStack_a8._0_4_);
    *(ulong *)&local_20[1].type_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    TVar7 = PeekPair(this);
    if (((TVar7._M_elems[0] == Lpar) && (TVar7._M_elems[1] < First_Literal)) &&
       ((0x2c008dd800U >> ((ulong)TVar7._M_elems >> 0x20 & 0x3f) & 1) != 0)) {
      RVar5 = ParseModuleFieldList(this,(Module *)(local_20 + 1));
      if (RVar5.enum_ == Error) {
        RVar5.enum_ = Error;
LAB_00dac578:
        if (local_20 != (ScriptModule *)0x0) {
          (*local_20->_vptr_ScriptModule[1])();
        }
        goto LAB_00dac50f;
      }
    }
    else {
      bVar4 = PeekMatch(this,Rpar);
      if (!bVar4) {
        ConsumeIfLpar(this);
        std::__cxx11::string::string
                  ((string *)(name.field_2._M_local_buf + 8),"a module field",&local_22);
        __l._M_len = 1;
        __l._M_array = (iterator)((long)&name.field_2 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_40,__l,&local_21);
        RVar5 = ErrorExpected(this,&local_40,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_40);
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
        goto LAB_00dac578;
      }
    }
    pSVar3 = local_20;
    local_20 = (ScriptModule *)0x0;
    pSVar1 = (out_module->_M_t).
             super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
             _M_t.
             super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
             super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
    (out_module->_M_t).
    super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
    super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = pSVar3;
    if ((pSVar1 != (ScriptModule *)0x0) &&
       ((*pSVar1->_vptr_ScriptModule[1])(), local_20 != (ScriptModule *)0x0)) {
      (*local_20->_vptr_ScriptModule[1])();
    }
  }
  RVar5 = Expect(this,Rpar);
  RVar5.enum_ = (Enum)(RVar5.enum_ == Error);
LAB_00dac50f:
  std::__cxx11::string::~string((string *)(loc.field_1.field2 + 8));
  return (Result)RVar5.enum_;
}

Assistant:

Result WastParser::ParseScriptModule(
    std::unique_ptr<ScriptModule>* out_module) {
  WABT_TRACE(ParseScriptModule);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Module);
  std::string name;
  ParseBindVarOpt(&name);

  switch (Peek()) {
    case TokenType::Bin: {
      Consume();
      std::vector<uint8_t> data;
      CHECK_RESULT(ParseTextList(&data));

      auto bsm = MakeUnique<BinaryScriptModule>();
      bsm->name = name;
      bsm->loc = loc;
      bsm->data = std::move(data);
      *out_module = std::move(bsm);
      break;
    }

    case TokenType::Quote: {
      Consume();
      std::vector<uint8_t> data;
      CHECK_RESULT(ParseTextList(&data));

      auto qsm = MakeUnique<QuotedScriptModule>();
      qsm->name = name;
      qsm->loc = loc;
      qsm->data = std::move(data);
      *out_module = std::move(qsm);
      break;
    }

    default: {
      auto tsm = MakeUnique<TextScriptModule>();
      tsm->module.name = name;
      tsm->module.loc = loc;
      if (IsModuleField(PeekPair())) {
        CHECK_RESULT(ParseModuleFieldList(&tsm->module));
      } else if (!PeekMatch(TokenType::Rpar)) {
        ConsumeIfLpar();
        return ErrorExpected({"a module field"});
      }
      *out_module = std::move(tsm);
      break;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}